

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::FString(FString *this,FString *head,FString *tail)

{
  uint uVar1;
  FStringData *pFVar2;
  ulong uVar3;
  size_t strlen;
  void *__dest;
  
  uVar1 = *(uint *)(head->Chars + -0xc);
  strlen = (ulong)*(uint *)(tail->Chars + -0xc) + (ulong)uVar1;
  pFVar2 = FStringData::Alloc(strlen);
  this->Chars = (char *)(pFVar2 + 1);
  pFVar2->Len = (uint)strlen;
  uVar3 = (ulong)*(uint *)(head->Chars + -0xc);
  memcpy(pFVar2 + 1,head->Chars,uVar3);
  *(undefined1 *)((long)&pFVar2[1].Len + uVar3) = 0;
  __dest = (void *)((long)&pFVar2[1].Len + (ulong)uVar1);
  uVar3 = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(__dest,tail->Chars,uVar3);
  *(undefined1 *)(uVar3 + (long)__dest) = 0;
  return;
}

Assistant:

FString::FString (const FString &head, const FString &tail)
{
	size_t len1 = head.Len();
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head);
	StrCopy (Chars + len1, tail);
}